

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
          (xr_writer *this,vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *container)

{
  bool bVar1;
  reference link;
  __normal_iterator<const_xray_re::way_link_*,_std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::begin(container);
  local_30._M_current =
       (way_link *)
       std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    link = __gnu_cxx::
           __normal_iterator<const_xray_re::way_link_*,_std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>_>
           ::operator*(&end);
    way_link_io::operator()((way_link_io *)((long)&this_local + 7),link,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::way_link_*,_std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}